

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O1

unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> __thiscall
duckdb::StandardBufferManager::ConstructManagedBuffer
          (StandardBufferManager *this,idx_t size,idx_t block_header_size,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *source,
          FileBufferType type)

{
  _func_int **pp_Var1;
  type source_00;
  FileBuffer *pFVar2;
  Allocator *allocator;
  pointer this_00;
  DBConfig *pDVar3;
  InternalException *this_01;
  pointer *__ptr;
  _Alloc_hider _Var4;
  undefined7 in_register_00000081;
  long *plVar5;
  int in_R9D;
  type tmp;
  string local_50;
  
  plVar5 = (long *)CONCAT71(in_register_00000081,type);
  (this->super_BufferManager)._vptr_BufferManager = (_func_int **)0x0;
  if (in_R9D == 1) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"ConstructManagedBuffer cannot be used to construct blocks","");
    InternalException::InternalException(this_01,&local_50);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*plVar5 == 0) {
    allocator = Allocator::Get(*(DatabaseInstance **)(size + 8));
    pFVar2 = (FileBuffer *)operator_new(0x38);
    FileBuffer::FileBuffer(pFVar2,allocator,(FileBufferType)in_R9D,block_header_size,(idx_t)source);
    _Var4._M_p = (pointer)(this->super_BufferManager)._vptr_BufferManager;
    (this->super_BufferManager)._vptr_BufferManager = (_func_int **)pFVar2;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)*plVar5;
    *plVar5 = 0;
    source_00 = unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>::
                operator*((unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
                           *)&local_50);
    pFVar2 = (FileBuffer *)operator_new(0x38);
    FileBuffer::FileBuffer(pFVar2,source_00,(FileBufferType)in_R9D);
    pp_Var1 = (this->super_BufferManager)._vptr_BufferManager;
    (this->super_BufferManager)._vptr_BufferManager = (_func_int **)pFVar2;
    _Var4._M_p = local_50._M_dataplus._M_p;
    if (pp_Var1 != (_func_int **)0x0) {
      (**(code **)(*pp_Var1 + 8))();
      _Var4._M_p = local_50._M_dataplus._M_p;
    }
  }
  if ((_func_int **)_Var4._M_p != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)_Var4._M_p + 8))();
  }
  this_00 = unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>::
            operator->((unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
                        *)this);
  pDVar3 = DBConfig::GetConfig(*(DatabaseInstance **)(size + 8));
  FileBuffer::Initialize(this_00,(pDVar3->options).debug_initialize);
  return (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)
         (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)this;
}

Assistant:

unique_ptr<FileBuffer> StandardBufferManager::ConstructManagedBuffer(idx_t size, idx_t block_header_size,
                                                                     unique_ptr<FileBuffer> &&source,
                                                                     FileBufferType type) {
	unique_ptr<FileBuffer> result;
	if (type == FileBufferType::BLOCK) {
		throw InternalException("ConstructManagedBuffer cannot be used to construct blocks");
	}
	if (source) {
		auto tmp = std::move(source);
		D_ASSERT(tmp->AllocSize() == BufferManager::GetAllocSize(size + block_header_size));
		result = make_uniq<FileBuffer>(*tmp, type);
	} else {
		// non re-usable buffer: allocate a new buffer
		result = make_uniq<FileBuffer>(Allocator::Get(db), type, size, block_header_size);
	}
	result->Initialize(DBConfig::GetConfig(db).options.debug_initialize);
	return result;
}